

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O1

void PlaceEggDoodads(int LayerWidth,int LayerHeight,CTile *aOutTiles,CTile *aGameLayerTiles,
                    int ItemWidth,int ItemHeight,int *aImageTileID,int ImageTileIDCount,int Freq)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  CTile *pCVar13;
  ulong uVar14;
  CTile *pCVar15;
  uchar uVar16;
  CTile *pCVar17;
  int iVar18;
  long lVar19;
  int local_9c;
  CTile *local_98;
  CTile *local_80;
  CTile *local_78;
  CTile *local_68;
  CTile *local_60;
  CTile *local_58;
  
  if (LayerHeight - ItemHeight != 0 && ItemHeight <= LayerHeight) {
    local_78 = aGameLayerTiles + LayerWidth;
    iVar7 = 0;
    uVar11 = 0;
    local_98 = aGameLayerTiles;
    local_80 = aOutTiles;
    do {
      if (0 < LayerWidth - ItemWidth) {
        local_58 = local_98;
        local_60 = local_80;
        local_68 = local_78;
        uVar8 = 0;
        local_9c = iVar7;
        do {
          if (ItemHeight < 1) {
LAB_0014d2e0:
            uVar5 = rand();
            uVar6 = rand();
            if ((int)((long)(ulong)((uVar5 & 0x7fff) << 0x10 | uVar6 & 0xffff) % (long)Freq) == 0) {
              uVar5 = rand();
              uVar6 = rand();
              if (0 < ItemHeight) {
                uVar4 = (uchar)aImageTileID
                               [(long)(ulong)(uVar6 & 0xffff | (uVar5 & 0x7fff) << 0x10) %
                                (long)ImageTileIDCount & 0xffffffff];
                uVar10 = 0;
                iVar9 = local_9c;
                do {
                  uVar14 = (ulong)(uint)ItemWidth;
                  uVar16 = uVar4;
                  iVar18 = iVar9;
                  if (0 < ItemWidth) {
                    do {
                      aOutTiles[iVar18].m_Index = uVar16;
                      uVar16 = uVar16 + '\x01';
                      iVar18 = iVar18 + 1;
                      uVar14 = uVar14 - 1;
                    } while (uVar14 != 0);
                  }
                  uVar10 = uVar10 + 1;
                  uVar4 = uVar4 + '\x10';
                  iVar9 = iVar9 + LayerWidth;
                } while (uVar10 != (uint)ItemHeight);
              }
            }
          }
          else {
            bVar3 = 1;
            uVar10 = 0;
            bVar12 = 0;
            bVar2 = 0;
            pCVar13 = local_58;
            pCVar15 = local_60;
            pCVar17 = local_68;
            do {
              if (0 < ItemWidth) {
                lVar19 = 1;
                do {
                  if (pCVar15[lVar19 + -1].m_Index == '\0') {
                    if (pCVar13[lVar19 + -1].m_Index == '\x01') {
                      bVar2 = 1;
                      goto LAB_0014d28d;
                    }
                    if ((uVar10 == ItemHeight - 1) &&
                       (bVar1 = false, pCVar17[lVar19 + -1].m_Index != '\x01')) {
                      bVar3 = 0;
                    }
                    else {
                      bVar1 = true;
                    }
                  }
                  else {
                    bVar12 = 1;
LAB_0014d28d:
                    bVar1 = false;
                  }
                } while ((bVar1) && (bVar1 = lVar19 < ItemWidth, lVar19 = lVar19 + 1, bVar1));
              }
              uVar10 = uVar10 + 1;
              pCVar17 = pCVar17 + LayerWidth;
              pCVar15 = pCVar15 + LayerWidth;
              pCVar13 = pCVar13 + LayerWidth;
            } while (uVar10 != (uint)ItemHeight);
            if (!(bool)(~bVar3 & 1) && !(bool)(bVar12 | bVar2)) goto LAB_0014d2e0;
          }
          uVar8 = uVar8 + 1;
          local_68 = local_68 + 1;
          local_60 = local_60 + 1;
          local_58 = local_58 + 1;
          local_9c = local_9c + 1;
        } while (uVar8 != (uint)(LayerWidth - ItemWidth));
      }
      uVar11 = uVar11 + 1;
      local_78 = local_78 + LayerWidth;
      local_80 = local_80 + LayerWidth;
      local_98 = local_98 + LayerWidth;
      iVar7 = iVar7 + LayerWidth;
    } while (uVar11 != (uint)(LayerHeight - ItemHeight));
  }
  return;
}

Assistant:

static void PlaceEggDoodads(int LayerWidth, int LayerHeight, CTile* aOutTiles, CTile* aGameLayerTiles, int ItemWidth, int ItemHeight, const int* aImageTileID, int ImageTileIDCount, int Freq)
{
	for(int y = 0; y < LayerHeight-ItemHeight; y++)
	{
		for(int x = 0; x < LayerWidth-ItemWidth; x++)
		{
			bool Overlap = false;
			bool ObstructedByWall = false;
			bool HasGround = true;

			for(int iy = 0; iy < ItemHeight; iy++)
			{
				for(int ix = 0; ix < ItemWidth; ix++)
				{
					int Tid = (y+iy) * LayerWidth + (x+ix);
					int DownTid = (y+iy+1) * LayerWidth + (x+ix);

					if(aOutTiles[Tid].m_Index != 0)
					{
						Overlap = true;
						break;
					}

					if(aGameLayerTiles[Tid].m_Index == 1)
					{
						ObstructedByWall = true;
						break;
					}

					if(iy == ItemHeight-1 && aGameLayerTiles[DownTid].m_Index != 1)
					{
						HasGround = false;
						break;
					}
				}
			}

			if(!Overlap && !ObstructedByWall && HasGround && random_int()%Freq == 0)
			{
				const int BaskerStartID = aImageTileID[random_int()%ImageTileIDCount];

				for(int iy = 0; iy < ItemHeight; iy++)
				{
					for(int ix = 0; ix < ItemWidth; ix++)
					{
						int Tid = (y+iy) * LayerWidth + (x+ix);
						aOutTiles[Tid].m_Index = BaskerStartID + iy * 16 + ix;
					}
				}
			}
		}
	}
}